

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cpp
# Opt level: O2

void __thiscall storage::BTree::print(BTree *this)

{
  BTNode *pBVar1;
  int iVar2;
  size_type sVar3;
  long lVar4;
  char *pcVar5;
  int i_1;
  value_type *__x;
  int i;
  ulong uVar6;
  int i_2;
  long lVar7;
  queue<storage::BTNode_*,_std::deque<storage::BTNode_*,_std::allocator<storage::BTNode_*>_>_> queue
  ;
  
  std::queue<storage::BTNode*,std::deque<storage::BTNode*,std::allocator<storage::BTNode*>>>::
  queue<std::deque<storage::BTNode*,std::allocator<storage::BTNode*>>,void>(&queue);
  if (this->root_ != (BTNode *)0x0) {
    std::deque<storage::BTNode_*,_std::allocator<storage::BTNode_*>_>::push_back
              (&queue.c,&this->root_);
  }
  while( true ) {
    while( true ) {
      sVar3 = std::deque<storage::BTNode_*,_std::allocator<storage::BTNode_*>_>::size(&queue.c);
      if (sVar3 == 0) {
        std::_Deque_base<storage::BTNode_*,_std::allocator<storage::BTNode_*>_>::~_Deque_base
                  ((_Deque_base<storage::BTNode_*,_std::allocator<storage::BTNode_*>_> *)&queue);
        return;
      }
      pBVar1 = *queue.c.super__Deque_base<storage::BTNode_*,_std::allocator<storage::BTNode_*>_>.
                _M_impl.super__Deque_impl_data._M_start._M_cur;
      std::deque<storage::BTNode_*,_std::allocator<storage::BTNode_*>_>::pop_front(&queue.c);
      iVar2 = (**pBVar1->_vptr_BTNode)(pBVar1);
      if ((char)iVar2 == '\0') break;
      putchar(0x28);
      uVar6 = 0;
      while( true ) {
        if ((long)pBVar1->used_links_count_ + -1 <= (long)uVar6) break;
        pcVar5 = "%d,";
        if (uVar6 == pBVar1->used_links_count_ - 2) {
          pcVar5 = "%d";
        }
        printf(pcVar5,(ulong)(uint)pBVar1->keys_[uVar6]);
        uVar6 = uVar6 + 1;
      }
      putchar(0x29);
      lVar4 = __dynamic_cast(pBVar1,&BTNode::typeinfo,&BTLeafNode::typeinfo,0);
      if (*(long *)(lVar4 + 0x270) != 0) {
        printf("->");
      }
    }
    lVar4 = __dynamic_cast(pBVar1,&BTNode::typeinfo,&BTInnerNode::typeinfo,0);
    if (lVar4 == 0) break;
    putchar(0x5b);
    uVar6 = 0;
    while( true ) {
      if ((long)*(int *)(lVar4 + 0xdc) + -1 <= (long)uVar6) break;
      pcVar5 = "%d,";
      if (uVar6 == *(int *)(lVar4 + 0xdc) - 2) {
        pcVar5 = "%d";
      }
      printf(pcVar5,(ulong)*(uint *)(lVar4 + 0x14 + uVar6 * 4));
      uVar6 = uVar6 + 1;
    }
    putchar(0x5d);
    __x = (value_type *)(lVar4 + 0xe0);
    for (lVar7 = 0; lVar7 < *(int *)(lVar4 + 0xdc); lVar7 = lVar7 + 1) {
      std::deque<storage::BTNode_*,_std::allocator<storage::BTNode_*>_>::push_back(&queue.c,__x);
      __x = __x + 1;
    }
    if ((*(long *)(lVar4 + 8) == 0) ||
       (*(int *)(lVar4 + 0x10) == *(int *)(*(long *)(lVar4 + 8) + 0xdc) + -1)) {
      putchar(10);
    }
  }
  __assert_fail("nd",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Raphael2017[P]BTree/btree.cpp"
                ,0x133,"void storage::BTree::print()");
}

Assistant:

void BTree::print() {
        std::queue<BTNode*> queue;
        if (root_)
            queue.push(root_);
        while (queue.size() > 0)
        {
            BTNode* node = queue.front();
            queue.pop();
            if (!node->is_leaf_node())
            {
                auto nd = dynamic_cast<BTInnerNode*>(node);
                assert(nd);
                printf("[");
                for (int i = 0; i < nd->key_count(); ++i)
                {
                    if (i == nd->key_count() - 1)
                    {
                        printf("%d", nd->keys_[i]);
                    }
                    else
                    {
                        printf("%d,", nd->keys_[i]);
                    }
                }
                printf("]");
                for (int i = 0; i < nd->used_links_count_; ++i)
                    queue.push(nd->links_[i]);
                if (!nd->parent_ || nd->child_index_ == nd->parent_->used_links_count_ - 1)
                {
                    printf("\n");
                }
            }
            else
            {
                printf("(");
                for (int i = 0; i < node->key_count(); ++i)
                {
                    if (i == node->key_count() - 1)
                    {
                        printf("%d", node->keys_[i]);
                    }
                    else
                    {
                        printf("%d,", node->keys_[i]);
                    }
                }
                printf(")");
                if (dynamic_cast<BTLeafNode*>(node)->next_)
                    printf("->");
            }
        }
    }